

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalGatherStats(Fts3Cursor *pCsr,Fts3Expr *pExpr)

{
  u8 uVar1;
  sqlite3_vtab *psVar2;
  long lVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined4 uVar12;
  int iVar13;
  void *pvVar14;
  bool bVar15;
  bool local_73;
  long local_70;
  Fts3Expr *pE;
  u8 bEof;
  sqlite3_int64 iDocid;
  sqlite3_int64 iPrevId;
  Fts3Expr *p;
  Fts3Expr *pRoot;
  Fts3Table *pTab;
  Fts3Expr *pFStack_20;
  int rc;
  Fts3Expr *pExpr_local;
  Fts3Cursor *pCsr_local;
  
  pTab._4_4_ = 0;
  if (pExpr->aMI == (u32 *)0x0) {
    psVar2 = (pCsr->base).pVtab;
    uVar8 = *(undefined1 *)&pCsr->iPrevId;
    uVar9 = *(undefined1 *)((long)&pCsr->iPrevId + 1);
    uVar10 = *(undefined1 *)((long)&pCsr->iPrevId + 2);
    uVar11 = *(undefined1 *)((long)&pCsr->iPrevId + 3);
    uVar12 = *(undefined4 *)((long)&pCsr->iPrevId + 4);
    p = pExpr;
    while( true ) {
      bVar15 = false;
      if (p->pParent != (Fts3Expr *)0x0) {
        bVar15 = p->pParent->eType == 1;
      }
      if (!bVar15) break;
      p = p->pParent;
    }
    lVar3 = p->iDocid;
    uVar1 = p->bEof;
    pFStack_20 = pExpr;
    pExpr_local = (Fts3Expr *)pCsr;
    for (iPrevId = (sqlite3_int64)p; iPrevId != 0; iPrevId = *(sqlite3_int64 *)(iPrevId + 0x10)) {
      if (*(int *)iPrevId == 5) {
        local_70 = iPrevId;
      }
      else {
        local_70 = *(long *)(iPrevId + 0x18);
      }
      pvVar14 = sqlite3_malloc64((long)(*(int *)&psVar2[2].pModule * 3) << 2);
      *(void **)(local_70 + 0x38) = pvVar14;
      if (*(long *)(local_70 + 0x38) == 0) {
        return 7;
      }
      memset(*(void **)(local_70 + 0x38),0,(long)(*(int *)&psVar2[2].pModule * 3) << 2);
    }
    fts3EvalRestart((Fts3Cursor *)pExpr_local,p,(int *)((long)&pTab + 4));
    while (*(char *)((long)&pExpr_local->pParent + 2) == '\0' && pTab._4_4_ == 0) {
      do {
        if (*(char *)((long)&pExpr_local->pParent + 3) == '\0') {
          sqlite3_reset((sqlite3_stmt *)pExpr_local->pLeft);
        }
        fts3EvalNextRow((Fts3Cursor *)pExpr_local,p,(int *)((long)&pTab + 4));
        *(u8 *)((long)&pExpr_local->pParent + 2) = p->bEof;
        *(undefined1 *)((long)&pExpr_local->pParent + 3) = 1;
        pExpr_local[1].bEof = '\x01';
        pExpr_local[1].bStart = '\0';
        pExpr_local[1].bDeferred = '\0';
        pExpr_local[1].field_0x33 = 0;
        uVar4 = *(undefined1 *)((long)&p->iDocid + 1);
        uVar5 = *(undefined1 *)((long)&p->iDocid + 2);
        uVar6 = *(undefined1 *)((long)&p->iDocid + 3);
        uVar7 = *(undefined4 *)((long)&p->iDocid + 4);
        pExpr_local->bEof = *(undefined1 *)&p->iDocid;
        pExpr_local->bStart = uVar4;
        pExpr_local->bDeferred = uVar5;
        pExpr_local->field_0x33 = uVar6;
        pExpr_local->iPhrase = uVar7;
        bVar15 = false;
        if ((*(char *)((long)&pExpr_local->pParent + 2) == '\0') && (bVar15 = false, p->eType == 1))
        {
          iVar13 = sqlite3Fts3EvalTestDeferred((Fts3Cursor *)pExpr_local,(int *)((long)&pTab + 4));
          bVar15 = iVar13 != 0;
        }
      } while (bVar15);
      if ((pTab._4_4_ == 0) && (*(char *)((long)&pExpr_local->pParent + 2) == '\0')) {
        fts3EvalUpdateCounts(p,*(int *)&psVar2[2].pModule);
      }
    }
    *(undefined1 *)((long)&pExpr_local->pParent + 2) = 0;
    pExpr_local->bEof = uVar8;
    pExpr_local->bStart = uVar9;
    pExpr_local->bDeferred = uVar10;
    pExpr_local->field_0x33 = uVar11;
    pExpr_local->iPhrase = uVar12;
    if (uVar1 == '\0') {
      fts3EvalRestart((Fts3Cursor *)pExpr_local,p,(int *)((long)&pTab + 4));
      do {
        fts3EvalNextRow((Fts3Cursor *)pExpr_local,p,(int *)((long)&pTab + 4));
        local_73 = p->iDocid != lVar3 && pTab._4_4_ == 0;
      } while (local_73);
    }
    else {
      p->bEof = uVar1;
    }
  }
  return pTab._4_4_;
}

Assistant:

static int fts3EvalGatherStats(
  Fts3Cursor *pCsr,               /* Cursor object */
  Fts3Expr *pExpr                 /* FTSQUERY_PHRASE expression */
){
  int rc = SQLITE_OK;             /* Return code */

  assert( pExpr->eType==FTSQUERY_PHRASE );
  if( pExpr->aMI==0 ){
    Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
    Fts3Expr *pRoot;                /* Root of NEAR expression */
    Fts3Expr *p;                    /* Iterator used for several purposes */

    sqlite3_int64 iPrevId = pCsr->iPrevId;
    sqlite3_int64 iDocid;
    u8 bEof;

    /* Find the root of the NEAR expression */
    pRoot = pExpr;
    while( pRoot->pParent && pRoot->pParent->eType==FTSQUERY_NEAR ){
      pRoot = pRoot->pParent;
    }
    iDocid = pRoot->iDocid;
    bEof = pRoot->bEof;
    assert( pRoot->bStart );

    /* Allocate space for the aMSI[] array of each FTSQUERY_PHRASE node */
    for(p=pRoot; p; p=p->pLeft){
      Fts3Expr *pE = (p->eType==FTSQUERY_PHRASE?p:p->pRight);
      assert( pE->aMI==0 );
      pE->aMI = (u32 *)sqlite3_malloc64(pTab->nColumn * 3 * sizeof(u32));
      if( !pE->aMI ) return SQLITE_NOMEM;
      memset(pE->aMI, 0, pTab->nColumn * 3 * sizeof(u32));
    }

    fts3EvalRestart(pCsr, pRoot, &rc);

    while( pCsr->isEof==0 && rc==SQLITE_OK ){

      do {
        /* Ensure the %_content statement is reset. */
        if( pCsr->isRequireSeek==0 ) sqlite3_reset(pCsr->pStmt);
        assert( sqlite3_data_count(pCsr->pStmt)==0 );

        /* Advance to the next document */
        fts3EvalNextRow(pCsr, pRoot, &rc);
        pCsr->isEof = pRoot->bEof;
        pCsr->isRequireSeek = 1;
        pCsr->isMatchinfoNeeded = 1;
        pCsr->iPrevId = pRoot->iDocid;
      }while( pCsr->isEof==0 
           && pRoot->eType==FTSQUERY_NEAR 
           && sqlite3Fts3EvalTestDeferred(pCsr, &rc) 
      );

      if( rc==SQLITE_OK && pCsr->isEof==0 ){
        fts3EvalUpdateCounts(pRoot, pTab->nColumn);
      }
    }

    pCsr->isEof = 0;
    pCsr->iPrevId = iPrevId;

    if( bEof ){
      pRoot->bEof = bEof;
    }else{
      /* Caution: pRoot may iterate through docids in ascending or descending
      ** order. For this reason, even though it seems more defensive, the 
      ** do loop can not be written:
      **
      **   do {...} while( pRoot->iDocid<iDocid && rc==SQLITE_OK );
      */
      fts3EvalRestart(pCsr, pRoot, &rc);
      do {
        fts3EvalNextRow(pCsr, pRoot, &rc);
        assert( pRoot->bEof==0 );
      }while( pRoot->iDocid!=iDocid && rc==SQLITE_OK );
    }
  }
  return rc;
}